

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_set_f32(ggml_tensor *tensor,float value)

{
  uint uVar1;
  size_t sVar2;
  undefined1 auVar3 [32];
  undefined2 uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  void *__s;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar13 [32];
  undefined1 auVar15 [32];
  
  if (tensor->type < 8) {
    uVar5 = tensor->ne[2] * tensor->ne[1] * tensor->ne[3];
    uVar1 = tensor->ne[0];
    uVar8 = (ulong)uVar1;
    sVar2 = tensor->nb[1];
    __s = tensor->data;
    auVar22 = in_ZMM5._0_32_;
    auVar23 = in_ZMM6._0_16_;
    auVar29 = in_ZMM8._0_32_;
    switch(tensor->type) {
    case GGML_TYPE_Q4_0:
      ggml_set_f32_cold_3();
    case GGML_TYPE_Q4_1:
      ggml_set_f32_cold_2();
    case GGML_TYPE_COUNT:
      ggml_set_f32_cold_1();
    case GGML_TYPE_I8:
      if (0 < (int)uVar5) {
        uVar9 = (ulong)uVar5;
        do {
          if (0 < (int)uVar1) {
            memset(__s,(int)value & 0xff,uVar8);
          }
          __s = (void *)((long)__s + sVar2);
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      break;
    case GGML_TYPE_I16:
      if (0 < (int)uVar5) {
        lVar7 = uVar8 - 1;
        auVar11._8_8_ = lVar7;
        auVar11._0_8_ = lVar7;
        auVar13._16_8_ = lVar7;
        auVar13._0_16_ = auVar11;
        auVar13._24_8_ = lVar7;
        lVar7 = (long)__s + 0x1e;
        uVar8 = 0;
        auVar3 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
        auVar26 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
        auVar16 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar18 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar20._8_8_ = 0x8000000000000000;
        auVar20._0_8_ = 0x8000000000000000;
        auVar23 = vpcmpeqd_avx(auVar23,auVar23);
        auVar27._8_8_ = 0x8000000000000000;
        auVar27._0_8_ = 0x8000000000000000;
        auVar27._16_8_ = 0x8000000000000000;
        auVar27._24_8_ = 0x8000000000000000;
        auVar22 = vpcmpeqd_avx2(auVar29,auVar29);
        do {
          if (0 < (int)uVar1) {
            lVar10 = 0;
            auVar29 = auVar18;
            auVar24 = auVar16;
            auVar15 = auVar26;
            auVar28 = auVar3;
            do {
              auVar12 = vpcmpgtq_avx(auVar29._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar12 = vpackssdw_avx(auVar12,auVar12);
              auVar12 = vpackssdw_avx(auVar12 ^ auVar23,auVar12 ^ auVar23);
              auVar12 = vpacksswb_avx(auVar12,auVar12);
              uVar4 = (undefined2)(int)value;
              if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x1e + lVar10) = uVar4;
              }
              auVar12 = vpcmpgtq_avx(auVar29._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar12 = vpackssdw_avx(auVar12,auVar12);
              auVar12 = vpackssdw_avx(auVar12 ^ auVar23,auVar12 ^ auVar23);
              auVar12 = vpacksswb_avx(auVar12,auVar12);
              if ((auVar12 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x1c + lVar10) = uVar4;
              }
              auVar31 = auVar13 ^ auVar27;
              auVar14 = vpcmpgtq_avx2(auVar29 ^ auVar27,auVar31);
              auVar17 = vpshuflw_avx2(auVar14,0xe8);
              auVar32._0_4_ = auVar17._16_4_;
              auVar32._4_4_ = auVar32._0_4_;
              auVar32._8_4_ = auVar32._0_4_;
              auVar32._12_4_ = auVar32._0_4_;
              auVar12 = vpackssdw_avx(auVar32 ^ auVar23,auVar32 ^ auVar23);
              auVar12 = vpacksswb_avx(auVar12,auVar12);
              if ((auVar12 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x1a + lVar10) = uVar4;
              }
              auVar12 = vpackssdw_avx(auVar14._16_16_,auVar14._16_16_);
              auVar12 = vpackssdw_avx(auVar12 ^ auVar23,auVar12 ^ auVar23);
              auVar12 = vpacksswb_avx(auVar12,auVar12);
              if ((auVar12 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x18 + lVar10) = uVar4;
              }
              auVar12 = vpcmpgtq_avx(auVar24._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar12 = vpackssdw_avx(auVar12,auVar12);
              auVar14 = vpermq_avx2(ZEXT1632(auVar12 ^ auVar23),0x55);
              auVar14 = vpackssdw_avx2(auVar14,auVar13);
              auVar12 = vpacksswb_avx(auVar14._16_16_,auVar14._16_16_);
              if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x16 + lVar10) = uVar4;
              }
              auVar12 = vpcmpgtq_avx(auVar24._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar12 = vpshufhw_avx(auVar12,0x84);
              auVar14 = vpermq_avx2(ZEXT1632(auVar12 ^ auVar23),0x55);
              auVar14 = vpackssdw_avx2(auVar14,auVar13);
              auVar12 = vpacksswb_avx(auVar14._16_16_,auVar14._16_16_);
              if ((auVar12 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x14 + lVar10) = uVar4;
              }
              auVar17 = vpcmpgtq_avx2(auVar24 ^ auVar27,auVar31);
              auVar14 = vpackssdw_avx2(auVar13,auVar17);
              auVar14 = vpackssdw_avx2(auVar14 ^ auVar22,auVar13);
              auVar12 = vpacksswb_avx(auVar14._16_16_,auVar14._16_16_);
              if ((auVar12 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x12 + lVar10) = uVar4;
              }
              auVar14 = vpackssdw_avx2(auVar13,auVar17);
              auVar14 = vpackssdw_avx2(auVar14 ^ auVar22,auVar13);
              auVar12 = vpacksswb_avx(auVar14._16_16_,auVar14._16_16_);
              if ((auVar12 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x10 + lVar10) = uVar4;
              }
              auVar12 = vpcmpgtq_avx(auVar15._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar12 = vpackssdw_avx(auVar12,auVar12);
              auVar12 = vpackssdw_avx(auVar12 ^ auVar23,auVar12 ^ auVar23);
              auVar12 = vpacksswb_avx(auVar12,auVar12);
              if ((auVar12 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0xe + lVar10) = uVar4;
              }
              auVar12 = vpcmpgtq_avx(auVar15._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar12 = vpackssdw_avx(auVar12,auVar12);
              auVar12 = vpackssdw_avx(auVar12 ^ auVar23,auVar12 ^ auVar23);
              auVar12 = vpacksswb_avx(auVar12,auVar12);
              if ((auVar12 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0xc + lVar10) = uVar4;
              }
              auVar14 = vpcmpgtq_avx2(auVar15 ^ auVar27,auVar31);
              auVar17 = vpshuflw_avx2(auVar14,0xe8);
              auVar33._0_4_ = auVar17._16_4_;
              auVar33._4_4_ = auVar33._0_4_;
              auVar33._8_4_ = auVar33._0_4_;
              auVar33._12_4_ = auVar33._0_4_;
              auVar12 = vpackssdw_avx(auVar33 ^ auVar23,auVar33 ^ auVar23);
              auVar12 = vpacksswb_avx(auVar12,auVar12);
              if ((auVar12 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -10 + lVar10) = uVar4;
              }
              auVar12 = vpackssdw_avx(auVar14._16_16_,auVar14._16_16_);
              auVar12 = vpackssdw_avx(auVar12 ^ auVar23,auVar12 ^ auVar23);
              auVar12 = vpacksswb_avx(auVar12,auVar12);
              if ((auVar12 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -8 + lVar10) = uVar4;
              }
              auVar12 = vpcmpgtq_avx(auVar28._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar12 = vpackssdw_avx(auVar12,auVar12);
              auVar14 = vpermq_avx2(ZEXT1632(auVar12 ^ auVar23),0x55);
              auVar14 = vpackssdw_avx2(auVar13,auVar14);
              auVar12 = vpacksswb_avx(auVar14._16_16_,auVar14._16_16_);
              if ((auVar12 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -6 + lVar10) = uVar4;
              }
              auVar12 = vpcmpgtq_avx(auVar28._0_16_ ^ auVar20,auVar11 ^ auVar20);
              auVar12 = vpshufhw_avx(auVar12,0x84);
              auVar14 = vpermq_avx2(ZEXT1632(auVar12 ^ auVar23),0x55);
              auVar14 = vpackssdw_avx2(auVar13,auVar14);
              auVar12 = vpacksswb_avx(auVar14._16_16_,auVar14._16_16_);
              if ((auVar12 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -4 + lVar10) = uVar4;
              }
              auVar17 = vpcmpgtq_avx2(auVar28 ^ auVar27,auVar31);
              auVar14 = vpackssdw_avx2(auVar13,auVar17);
              auVar14 = vpackssdw_avx2(auVar13,auVar14 ^ auVar22);
              auVar12 = vpacksswb_avx(auVar14._16_16_,auVar14._16_16_);
              if ((auVar12 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -2 + lVar10) = uVar4;
              }
              auVar14 = vpackssdw_avx2(auVar13,auVar17);
              auVar14 = vpackssdw_avx2(auVar13,auVar14 ^ auVar22);
              auVar12 = vpacksswb_avx(auVar14._16_16_,auVar14._16_16_);
              if ((auVar12 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + lVar10) = uVar4;
              }
              auVar30._8_8_ = 0x10;
              auVar30._0_8_ = 0x10;
              auVar30._16_8_ = 0x10;
              auVar30._24_8_ = 0x10;
              auVar29 = vpaddq_avx2(auVar29,auVar30);
              auVar24 = vpaddq_avx2(auVar24,auVar30);
              auVar15 = vpaddq_avx2(auVar15,auVar30);
              auVar28 = vpaddq_avx2(auVar28,auVar30);
              lVar10 = lVar10 + 0x20;
            } while ((ulong)(uVar1 + 0xf >> 4) << 5 != lVar10);
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + sVar2;
        } while (uVar8 != uVar5);
      }
      break;
    case GGML_TYPE_I32:
      if (0 < (int)uVar5) {
        iVar6 = (int)value;
        lVar7 = uVar8 - 1;
        auVar19._8_8_ = lVar7;
        auVar19._0_8_ = lVar7;
        auVar19._16_8_ = lVar7;
        auVar19._24_8_ = lVar7;
        auVar14._4_4_ = iVar6;
        auVar14._0_4_ = iVar6;
        auVar14._8_4_ = iVar6;
        auVar14._12_4_ = iVar6;
        auVar14._16_4_ = iVar6;
        auVar14._20_4_ = iVar6;
        auVar14._24_4_ = iVar6;
        auVar14._28_4_ = iVar6;
        uVar8 = 0;
        auVar29 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar3 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar17._8_8_ = 0x8000000000000000;
        auVar17._0_8_ = 0x8000000000000000;
        auVar17._16_8_ = 0x8000000000000000;
        auVar17._24_8_ = 0x8000000000000000;
        auVar22 = vpcmpeqd_avx2(auVar22,auVar22);
        do {
          if (0 < (int)uVar1) {
            uVar9 = 0;
            do {
              auVar25._8_8_ = uVar9;
              auVar25._0_8_ = uVar9;
              auVar25._16_8_ = uVar9;
              auVar25._24_8_ = uVar9;
              auVar16 = vpor_avx2(auVar25,auVar29);
              auVar26 = vpor_avx2(auVar25,auVar3);
              auVar26 = vpcmpgtq_avx2(auVar26 ^ auVar17,auVar19 ^ auVar17);
              auVar16 = vpcmpgtq_avx2(auVar16 ^ auVar17,auVar19 ^ auVar17);
              auVar26 = vpackssdw_avx2(auVar16,auVar26);
              auVar23 = vpackssdw_avx(SUB3216(auVar26 ^ auVar22,0),SUB3216(auVar26 ^ auVar22,0x10));
              auVar23 = vpshufd_avx(auVar23,0xd8);
              auVar26 = vpmovzxwd_avx2(auVar23);
              auVar26 = vpslld_avx2(auVar26,0x1f);
              auVar26 = vpmaskmovd_avx2(auVar26,auVar14);
              *(undefined1 (*) [32])((long)__s + uVar9 * 4) = auVar26;
              uVar9 = uVar9 + 8;
            } while ((uVar1 + 7 & 0xfffffff8) != uVar9);
          }
          uVar8 = uVar8 + 1;
          __s = (void *)((long)__s + sVar2);
        } while (uVar8 != uVar5);
      }
      break;
    case GGML_TYPE_F16:
      if (0 < (int)uVar5) {
        lVar7 = uVar8 - 1;
        auVar12._8_8_ = lVar7;
        auVar12._0_8_ = lVar7;
        auVar15._16_8_ = lVar7;
        auVar15._0_16_ = auVar12;
        auVar15._24_8_ = lVar7;
        lVar7 = (long)__s + 0x1e;
        uVar8 = 0;
        auVar3 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
        auVar26 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
        auVar16 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar18 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar21._8_8_ = 0x8000000000000000;
        auVar21._0_8_ = 0x8000000000000000;
        auVar23 = vpcmpeqd_avx(auVar23,auVar23);
        auVar28._8_8_ = 0x8000000000000000;
        auVar28._0_8_ = 0x8000000000000000;
        auVar28._16_8_ = 0x8000000000000000;
        auVar28._24_8_ = 0x8000000000000000;
        auVar22 = vpcmpeqd_avx2(auVar29,auVar29);
        do {
          if (0 < (int)uVar1) {
            lVar10 = 0;
            auVar29 = auVar18;
            auVar24 = auVar16;
            auVar14 = auVar26;
            auVar17 = auVar3;
            do {
              auVar34 = vpcmpgtq_avx(auVar29._0_16_ ^ auVar21,auVar12 ^ auVar21);
              auVar34 = vpackssdw_avx(auVar34,auVar34);
              auVar34 = vpackssdw_avx(auVar34 ^ auVar23,auVar34 ^ auVar23);
              auVar34 = vpacksswb_avx(auVar34,auVar34);
              uVar4 = (undefined2)(int)value;
              if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x1e + lVar10) = uVar4;
              }
              auVar34 = vpcmpgtq_avx(auVar29._0_16_ ^ auVar21,auVar12 ^ auVar21);
              auVar34 = vpackssdw_avx(auVar34,auVar34);
              auVar34 = vpackssdw_avx(auVar34 ^ auVar23,auVar34 ^ auVar23);
              auVar34 = vpacksswb_avx(auVar34,auVar34);
              if ((auVar34 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x1c + lVar10) = uVar4;
              }
              auVar25 = auVar15 ^ auVar28;
              auVar31 = vpcmpgtq_avx2(auVar29 ^ auVar28,auVar25);
              auVar19 = vpshuflw_avx2(auVar31,0xe8);
              auVar34._0_4_ = auVar19._16_4_;
              auVar34._4_4_ = auVar34._0_4_;
              auVar34._8_4_ = auVar34._0_4_;
              auVar34._12_4_ = auVar34._0_4_;
              auVar34 = vpackssdw_avx(auVar34 ^ auVar23,auVar34 ^ auVar23);
              auVar34 = vpacksswb_avx(auVar34,auVar34);
              if ((auVar34 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x1a + lVar10) = uVar4;
              }
              auVar34 = vpackssdw_avx(auVar31._16_16_,auVar31._16_16_);
              auVar34 = vpackssdw_avx(auVar34 ^ auVar23,auVar34 ^ auVar23);
              auVar34 = vpacksswb_avx(auVar34,auVar34);
              if ((auVar34 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x18 + lVar10) = uVar4;
              }
              auVar34 = vpcmpgtq_avx(auVar24._0_16_ ^ auVar21,auVar12 ^ auVar21);
              auVar34 = vpackssdw_avx(auVar34,auVar34);
              auVar31 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar23),0x55);
              auVar31 = vpackssdw_avx2(auVar31,auVar15);
              auVar34 = vpacksswb_avx(auVar31._16_16_,auVar31._16_16_);
              if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x16 + lVar10) = uVar4;
              }
              auVar34 = vpcmpgtq_avx(auVar24._0_16_ ^ auVar21,auVar12 ^ auVar21);
              auVar34 = vpshufhw_avx(auVar34,0x84);
              auVar31 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar23),0x55);
              auVar31 = vpackssdw_avx2(auVar31,auVar15);
              auVar34 = vpacksswb_avx(auVar31._16_16_,auVar31._16_16_);
              if ((auVar34 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x14 + lVar10) = uVar4;
              }
              auVar19 = vpcmpgtq_avx2(auVar24 ^ auVar28,auVar25);
              auVar31 = vpackssdw_avx2(auVar15,auVar19);
              auVar31 = vpackssdw_avx2(auVar31 ^ auVar22,auVar15);
              auVar34 = vpacksswb_avx(auVar31._16_16_,auVar31._16_16_);
              if ((auVar34 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x12 + lVar10) = uVar4;
              }
              auVar31 = vpackssdw_avx2(auVar15,auVar19);
              auVar31 = vpackssdw_avx2(auVar31 ^ auVar22,auVar15);
              auVar34 = vpacksswb_avx(auVar31._16_16_,auVar31._16_16_);
              if ((auVar34 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0x10 + lVar10) = uVar4;
              }
              auVar34 = vpcmpgtq_avx(auVar14._0_16_ ^ auVar21,auVar12 ^ auVar21);
              auVar34 = vpackssdw_avx(auVar34,auVar34);
              auVar34 = vpackssdw_avx(auVar34 ^ auVar23,auVar34 ^ auVar23);
              auVar34 = vpacksswb_avx(auVar34,auVar34);
              if ((auVar34 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0xe + lVar10) = uVar4;
              }
              auVar34 = vpcmpgtq_avx(auVar14._0_16_ ^ auVar21,auVar12 ^ auVar21);
              auVar34 = vpackssdw_avx(auVar34,auVar34);
              auVar34 = vpackssdw_avx(auVar34 ^ auVar23,auVar34 ^ auVar23);
              auVar34 = vpacksswb_avx(auVar34,auVar34);
              if ((auVar34 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -0xc + lVar10) = uVar4;
              }
              auVar31 = vpcmpgtq_avx2(auVar14 ^ auVar28,auVar25);
              auVar19 = vpshuflw_avx2(auVar31,0xe8);
              auVar35._0_4_ = auVar19._16_4_;
              auVar35._4_4_ = auVar35._0_4_;
              auVar35._8_4_ = auVar35._0_4_;
              auVar35._12_4_ = auVar35._0_4_;
              auVar34 = vpackssdw_avx(auVar35 ^ auVar23,auVar35 ^ auVar23);
              auVar34 = vpacksswb_avx(auVar34,auVar34);
              if ((auVar34 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -10 + lVar10) = uVar4;
              }
              auVar34 = vpackssdw_avx(auVar31._16_16_,auVar31._16_16_);
              auVar34 = vpackssdw_avx(auVar34 ^ auVar23,auVar34 ^ auVar23);
              auVar34 = vpacksswb_avx(auVar34,auVar34);
              if ((auVar34 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -8 + lVar10) = uVar4;
              }
              auVar34 = vpcmpgtq_avx(auVar17._0_16_ ^ auVar21,auVar12 ^ auVar21);
              auVar34 = vpackssdw_avx(auVar34,auVar34);
              auVar31 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar23),0x55);
              auVar31 = vpackssdw_avx2(auVar15,auVar31);
              auVar34 = vpacksswb_avx(auVar31._16_16_,auVar31._16_16_);
              if ((auVar34 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -6 + lVar10) = uVar4;
              }
              auVar34 = vpcmpgtq_avx(auVar17._0_16_ ^ auVar21,auVar12 ^ auVar21);
              auVar34 = vpshufhw_avx(auVar34,0x84);
              auVar31 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar23),0x55);
              auVar31 = vpackssdw_avx2(auVar15,auVar31);
              auVar34 = vpacksswb_avx(auVar31._16_16_,auVar31._16_16_);
              if ((auVar34 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -4 + lVar10) = uVar4;
              }
              auVar19 = vpcmpgtq_avx2(auVar17 ^ auVar28,auVar25);
              auVar31 = vpackssdw_avx2(auVar15,auVar19);
              auVar31 = vpackssdw_avx2(auVar15,auVar31 ^ auVar22);
              auVar34 = vpacksswb_avx(auVar31._16_16_,auVar31._16_16_);
              if ((auVar34 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + -2 + lVar10) = uVar4;
              }
              auVar31 = vpackssdw_avx2(auVar15,auVar19);
              auVar31 = vpackssdw_avx2(auVar15,auVar31 ^ auVar22);
              auVar34 = vpacksswb_avx(auVar31._16_16_,auVar31._16_16_);
              if ((auVar34 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar7 + lVar10) = uVar4;
              }
              auVar31._8_8_ = 0x10;
              auVar31._0_8_ = 0x10;
              auVar31._16_8_ = 0x10;
              auVar31._24_8_ = 0x10;
              auVar29 = vpaddq_avx2(auVar29,auVar31);
              auVar24 = vpaddq_avx2(auVar24,auVar31);
              auVar14 = vpaddq_avx2(auVar14,auVar31);
              auVar17 = vpaddq_avx2(auVar17,auVar31);
              lVar10 = lVar10 + 0x20;
            } while ((ulong)(uVar1 + 0xf >> 4) << 5 != lVar10);
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + sVar2;
        } while (uVar8 != uVar5);
      }
      break;
    case GGML_TYPE_F32:
      if (0 < (int)uVar5) {
        lVar7 = uVar8 - 1;
        auVar18._8_8_ = lVar7;
        auVar18._0_8_ = lVar7;
        auVar18._16_8_ = lVar7;
        auVar18._24_8_ = lVar7;
        auVar26._4_4_ = value;
        auVar26._0_4_ = value;
        auVar26._8_4_ = value;
        auVar26._12_4_ = value;
        auVar26._16_4_ = value;
        auVar26._20_4_ = value;
        auVar26._24_4_ = value;
        auVar26._28_4_ = value;
        uVar8 = 0;
        auVar29 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar3 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar16._8_8_ = 0x8000000000000000;
        auVar16._0_8_ = 0x8000000000000000;
        auVar16._16_8_ = 0x8000000000000000;
        auVar16._24_8_ = 0x8000000000000000;
        auVar22 = vpcmpeqd_avx2(auVar22,auVar22);
        do {
          if (0 < (int)uVar1) {
            uVar9 = 0;
            do {
              auVar24._8_8_ = uVar9;
              auVar24._0_8_ = uVar9;
              auVar24._16_8_ = uVar9;
              auVar24._24_8_ = uVar9;
              auVar15 = vpor_avx2(auVar24,auVar29);
              auVar24 = vpor_avx2(auVar24,auVar3);
              auVar24 = vpcmpgtq_avx2(auVar24 ^ auVar16,auVar18 ^ auVar16);
              auVar15 = vpcmpgtq_avx2(auVar15 ^ auVar16,auVar18 ^ auVar16);
              auVar24 = vpackssdw_avx2(auVar15,auVar24);
              auVar23 = vpackssdw_avx(SUB3216(auVar24 ^ auVar22,0),SUB3216(auVar24 ^ auVar22,0x10));
              auVar23 = vpshufd_avx(auVar23,0xd8);
              auVar24 = vpmovzxwd_avx2(auVar23);
              auVar24 = vpslld_avx2(auVar24,0x1f);
              auVar24 = vmaskmovps_avx(auVar24,auVar26);
              *(undefined1 (*) [32])((long)__s + uVar9 * 4) = auVar24;
              uVar9 = uVar9 + 8;
            } while ((uVar1 + 7 & 0xfffffff8) != uVar9);
          }
          uVar8 = uVar8 + 1;
          __s = (void *)((long)__s + sVar2);
        } while (uVar8 != uVar5);
      }
    }
  }
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_set_f32(struct ggml_tensor * tensor, float value) {
    const int n     = ggml_nrows(tensor);
    const int nc    = tensor->ne[0];
    const size_t n1 = tensor->nb[1];

    char * const data = tensor->data;

    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                assert(tensor->nb[0] == sizeof(int8_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i8(nc, (int8_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I16:
            {
                assert(tensor->nb[0] == sizeof(int16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i16(nc, (int16_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I32:
            {
                assert(tensor->nb[0] == sizeof(int32_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i32(nc, (int32_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_F16:
            {
                assert(tensor->nb[0] == sizeof(ggml_fp16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f16(nc, (ggml_fp16_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_F32:
            {
                assert(tensor->nb[0] == sizeof(float));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f32(nc, (float *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }

    return tensor;
}